

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

void __thiscall Assimp::ExporterPimpl::ExporterPimpl(ExporterPimpl *this)

{
  DefaultIOSystem *__p;
  
  this->blob = (aiExportDataBlob *)0x0;
  __p = (DefaultIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x20);
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__IOSystem_007f3928;
  std::__shared_ptr<Assimp::IOSystem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::DefaultIOSystem,void>
            ((__shared_ptr<Assimp::IOSystem,(__gnu_cxx::_Lock_policy)2> *)&this->mIOSystem,__p);
  this->mIsDefaultIOHandler = true;
  this->mProgressHandler = (ProgressHandler *)0x0;
  this->mIsDefaultProgressHandler = true;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mError)._M_dataplus._M_p = (pointer)&(this->mError).field_2;
  (this->mError)._M_string_length = 0;
  (this->mError).field_2._M_local_buf[0] = '\0';
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetPostProcessingStepInstanceList(&this->mPostProcessingSteps);
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::resize(&this->mExporters,0x15);
  memmove((this->mExporters).
          super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
          ._M_impl.super__Vector_impl_data._M_start,gExporters,0x348);
  return;
}

Assistant:

ExporterPimpl()
    : blob()
    , mIOSystem(new Assimp::DefaultIOSystem())
    , mIsDefaultIOHandler(true)
    , mProgressHandler( nullptr )
    , mIsDefaultProgressHandler( true )
    , mPostProcessingSteps()
    , mError()
    , mExporters() {
        GetPostProcessingStepInstanceList(mPostProcessingSteps);

        // grab all built-in exporters
        if ( 0 != ( ASSIMP_NUM_EXPORTERS ) ) {
            mExporters.resize( ASSIMP_NUM_EXPORTERS );
            std::copy( gExporters, gExporters + ASSIMP_NUM_EXPORTERS, mExporters.begin() );
        }
    }